

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraint.cpp
# Opt level: O2

void __thiscall chrono::ChConstraint::ArchiveIN(ChConstraint *this,ChArchiveIn *marchive)

{
  eChConstraintMode_mapper typemapper;
  ChEnumMapper<chrono::eChConstraintMode> CStack_f8;
  ChEnumMapper<chrono::eChConstraintMode> local_d8;
  ChNameValue<chrono::ChEnumMapper<chrono::eChConstraintMode>_> local_b8;
  ChNameValue<bool> local_a0;
  ChNameValue<bool> local_88;
  ChNameValue<bool> local_70;
  ChNameValue<bool> local_58;
  ChNameValue<double> local_40;
  
  ChArchiveIn::VersionRead<chrono::ChConstraint>(marchive);
  local_40._value = &this->cfm_i;
  local_40._name = "cfm_i";
  local_40._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_40);
  local_58._value = &this->valid;
  local_58._name = "valid";
  local_58._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_58);
  local_70._value = &this->disabled;
  local_70._name = "disabled";
  local_70._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_70);
  local_88._value = &this->redundant;
  local_88._name = "redundant";
  local_88._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_88);
  local_a0._value = &this->broken;
  local_a0._name = "broken";
  local_a0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a0);
  eChConstraintMode_mapper::eChConstraintMode_mapper((eChConstraintMode_mapper *)&local_d8);
  eChConstraintMode_mapper::operator()(&CStack_f8,(eChConstraintMode_mapper *)&local_d8,&this->mode)
  ;
  local_b8._name = "mode";
  local_b8._flags = '\0';
  local_b8._value = &CStack_f8;
  ChArchiveIn::operator>>(marchive,&local_b8);
  ChEnumMapper<chrono::eChConstraintMode>::~ChEnumMapper(&CStack_f8);
  ChEnumMapper<chrono::eChConstraintMode>::~ChEnumMapper(&local_d8);
  return;
}

Assistant:

void ChConstraint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraint>();

    // stream in all member data:
    marchive >> CHNVP(cfm_i);
    marchive >> CHNVP(valid);
    marchive >> CHNVP(disabled);
    marchive >> CHNVP(redundant);
    marchive >> CHNVP(broken);
    eChConstraintMode_mapper typemapper;
    marchive >> CHNVP(typemapper(this->mode), "mode");
}